

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBox::setMinimumContentsLength(QComboBox *this,int characters)

{
  QComboBoxPrivate *this_00;
  
  if (((-1 < characters) &&
      (this_00 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8,
      this_00->minimumContentsLength != characters)) &&
     (this_00->minimumContentsLength = characters,
     (this_00->sizeAdjustPolicy & ~AdjustToMinimumContentsLengthWithIcon) == AdjustToContents)) {
    (this_00->sizeHint).wd = -1;
    (this_00->sizeHint).ht = -1;
    QComboBoxPrivate::adjustComboBoxSize(this_00);
    QWidget::updateGeometry(&this->super_QWidget);
    return;
  }
  return;
}

Assistant:

void QComboBox::setMinimumContentsLength(int characters)
{
    Q_D(QComboBox);
    if (characters == d->minimumContentsLength || characters < 0)
        return;

    d->minimumContentsLength = characters;

    if (d->sizeAdjustPolicy == AdjustToContents
        || d->sizeAdjustPolicy == AdjustToMinimumContentsLengthWithIcon) {
        d->sizeHint = QSize();
        d->adjustComboBoxSize();
        updateGeometry();
    }
}